

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

ScenarioLowerBound * __thiscall
despot::BaseTag::CreateScenarioLowerBound(BaseTag *this,string *name,string *particle_bound_name)

{
  BeliefMDP *model;
  StatePolicy *pSVar1;
  OBS_TYPE OVar2;
  pointer pcVar3;
  int iVar4;
  TagHistoryModePolicy *this_00;
  ParticleLowerBound *pPVar5;
  TrivialParticleLowerBound *this_01;
  ostream *poVar6;
  long *plVar7;
  long *plVar8;
  long *local_210 [2];
  long local_200 [2];
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  string local_1b0;
  long *local_190 [2];
  long local_180 [2];
  string local_170;
  long *local_150 [2];
  long local_140 [2];
  string local_130;
  long *local_110 [2];
  long local_100 [2];
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  model = &this->super_BeliefMDP;
  iVar4 = std::__cxx11::string::compare((char *)name);
  if (iVar4 == 0) {
    this_01 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_01,(DSPOMDP *)model);
    return (ScenarioLowerBound *)this_01;
  }
  iVar4 = std::__cxx11::string::compare((char *)name);
  if (iVar4 == 0) {
    this_00 = (TagHistoryModePolicy *)operator_new(0x38);
    plVar7 = local_40;
    pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
    local_50[0] = plVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
    pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_50);
    despot::RandomPolicy::RandomPolicy((RandomPolicy *)this_00,(DSPOMDP *)model,pPVar5);
    plVar8 = local_50[0];
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)name);
    if ((iVar4 == 0) ||
       ((iVar4 = std::__cxx11::string::compare((char *)name), iVar4 == 0 &&
        (OVar2 = this->same_loc_obs_, iVar4 = despot::Floor::NumCells(), OVar2 != (long)iVar4)))) {
      this_00 = (TagHistoryModePolicy *)operator_new(0x68);
      plVar7 = local_60;
      pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
      local_70[0] = plVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
      pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_70);
      TagSHRPolicy::TagSHRPolicy((TagSHRPolicy *)this_00,(DSPOMDP *)model,pPVar5);
      plVar8 = local_70[0];
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)name);
      if (iVar4 == 0) {
        this_00 = (TagHistoryModePolicy *)operator_new(0xa8);
        plVar7 = local_80;
        pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
        local_90[0] = plVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
        pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_90);
        TagHistoryModePolicy::TagHistoryModePolicy(this_00,(DSPOMDP *)model,pPVar5);
        plVar8 = local_90[0];
      }
      else {
        pSVar1 = &this->super_StatePolicy;
        iVar4 = std::__cxx11::string::compare((char *)name);
        if (iVar4 == 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MDP","");
          ComputeDefaultActions(this,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          this_00 = (TagHistoryModePolicy *)operator_new(0x30);
          plVar7 = local_c0;
          pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
          local_d0[0] = plVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
          pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_d0);
          despot::MMAPStatePolicy::MMAPStatePolicy
                    ((MMAPStatePolicy *)this_00,(DSPOMDP *)model,&this->super_MMAPInferencer,pSVar1,
                     pPVar5);
          plVar8 = local_d0[0];
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)name);
          if (iVar4 == 0) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SP","");
            ComputeDefaultActions(this,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            this_00 = (TagHistoryModePolicy *)operator_new(0x30);
            plVar7 = local_100;
            pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
            local_110[0] = plVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_110,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
            pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_110);
            despot::MMAPStatePolicy::MMAPStatePolicy
                      ((MMAPStatePolicy *)this_00,(DSPOMDP *)model,&this->super_MMAPInferencer,
                       pSVar1,pPVar5);
            plVar8 = local_110[0];
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)name);
            if ((iVar4 == 0) ||
               ((iVar4 = std::__cxx11::string::compare((char *)name), iVar4 == 0 &&
                (OVar2 = this->same_loc_obs_, iVar4 = despot::Floor::NumCells(),
                OVar2 == (long)iVar4)))) {
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"MDP","");
              ComputeDefaultActions(this,&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              this_00 = (TagHistoryModePolicy *)operator_new(0x48);
              plVar7 = local_140;
              pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
              local_150[0] = plVar7;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_150,pcVar3,pcVar3 + particle_bound_name->_M_string_length);
              pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_150);
              despot::ModeStatePolicy::ModeStatePolicy
                        ((ModeStatePolicy *)this_00,(DSPOMDP *)model,&this->super_StateIndexer,
                         pSVar1,pPVar5);
              plVar8 = local_150[0];
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)name);
              if (iVar4 == 0) {
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"SP","");
                ComputeDefaultActions(this,&local_170);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
                this_00 = (TagHistoryModePolicy *)operator_new(0x48);
                plVar7 = local_180;
                pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
                local_190[0] = plVar7;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_190,pcVar3,pcVar3 + particle_bound_name->_M_string_length
                          );
                pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,local_190)
                ;
                despot::ModeStatePolicy::ModeStatePolicy
                          ((ModeStatePolicy *)this_00,(DSPOMDP *)model,&this->super_StateIndexer,
                           pSVar1,pPVar5);
                plVar8 = local_190[0];
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)name);
                if (iVar4 == 0) {
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"MDP","");
                  ComputeDefaultActions(this,&local_1b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  this_00 = (TagHistoryModePolicy *)operator_new(0x28);
                  plVar7 = local_1c0;
                  pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
                  local_1d0[0] = plVar7;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1d0,pcVar3,
                             pcVar3 + particle_bound_name->_M_string_length);
                  pPVar5 = (ParticleLowerBound *)
                           (**(code **)(*(long *)model + 0x70))(model,local_1d0);
                  despot::MajorityActionPolicy::MajorityActionPolicy
                            ((MajorityActionPolicy *)this_00,(DSPOMDP *)model,pSVar1,pPVar5);
                  plVar8 = local_1d0[0];
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)name);
                  if (iVar4 != 0) {
                    iVar4 = std::__cxx11::string::compare((char *)name);
                    if (iVar4 != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Unsupported lower bound: ",0x19);
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                          name->_M_string_length);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                             "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)"
                                            );
                    std::endl<char,std::char_traits<char>>(poVar6);
                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                             "With base lower bound: except TRIVIAL");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    exit(1);
                  }
                  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"SP","");
                  ComputeDefaultActions(this,&local_1f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  this_00 = (TagHistoryModePolicy *)operator_new(0x28);
                  plVar7 = local_200;
                  pcVar3 = (particle_bound_name->_M_dataplus)._M_p;
                  local_210[0] = plVar7;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_210,pcVar3,
                             pcVar3 + particle_bound_name->_M_string_length);
                  pPVar5 = (ParticleLowerBound *)
                           (**(code **)(*(long *)model + 0x70))(model,local_210);
                  despot::MajorityActionPolicy::MajorityActionPolicy
                            ((MajorityActionPolicy *)this_00,(DSPOMDP *)model,pSVar1,pPVar5);
                  plVar8 = local_210[0];
                }
              }
            }
          }
        }
      }
    }
  }
  if (plVar8 != plVar7) {
    operator_delete(plVar8,*plVar7 + 1);
  }
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* BaseTag::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	const MMAPInferencer* mmap_inferencer = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SHR"
		|| (name == "DEFAULT" && same_loc_obs_ != floor_.NumCells())) {
		return new TagSHRPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "HM") {
		return new TagHistoryModePolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-MDP") {
		ComputeDefaultActions("MDP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-SP") {
		ComputeDefaultActions("SP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-MDP"
		|| (name == "DEFAULT" && same_loc_obs_ == floor_.NumCells())) {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-SP") {
		ComputeDefaultActions("SP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-MDP") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-SP") {
		ComputeDefaultActions("SP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)" << endl;
		cerr << "With base lower bound: except TRIVIAL" << endl;
		exit(1);
		return NULL;
	}
}